

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O1

void __thiscall
QPDFAcroFormDocumentHelper::removeFormFields
          (QPDFAcroFormDocumentHelper *this,
          set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *to_remove)

{
  _Base_ptr __k;
  _Base_ptr p_Var1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  iterator iVar5;
  iterator iVar6;
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  *this_00;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  const_iterator cVar9;
  int at;
  _Base_ptr p_Var10;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
  *this_01;
  map<QPDFObjGen,_QPDFFormFieldObjectHelper,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFFormFieldObjectHelper>_>_>
  *this_02;
  map<QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>_>
  *this_03;
  _Base_ptr *__k_00;
  map<QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_04;
  pair<std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFFormFieldObjectHelper>_>,_std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFFormFieldObjectHelper>_>_>
  pVar11;
  pair<std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>_>
  pVar12;
  pair<std::_Rb_tree_iterator<QPDFObjGen>,_std::_Rb_tree_iterator<QPDFObjGen>_> pVar13;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
  pVar14;
  pair<std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar15;
  QPDFObjectHandle fields;
  QPDFAnnotationObjectHelper aoh;
  QPDFObjectHandle acroform;
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Base_ptr local_98;
  _Base_ptr local_90;
  long local_88;
  _Base_ptr local_80;
  _Base_ptr local_78;
  QPDFObjectHandle local_70;
  _Base_ptr local_60;
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  *local_58;
  undefined1 local_50 [32];
  
  local_58 = &to_remove->_M_t;
  QPDF::getRoot((QPDF *)local_b8);
  local_a8._M_allocated_capacity = (size_type)&local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"/AcroForm","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_50,(string *)local_b8);
  if ((_Base_ptr *)local_a8._M_allocated_capacity != &local_98) {
    operator_delete((void *)local_a8._M_allocated_capacity,(ulong)((long)&local_98->_M_color + 1));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
  }
  bVar3 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_50);
  if (bVar3) {
    local_a8._M_allocated_capacity = (size_type)&local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"/Fields","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_b8,(string *)local_50);
    if ((_Base_ptr *)local_a8._M_allocated_capacity != &local_98) {
      operator_delete((void *)local_a8._M_allocated_capacity,(ulong)((long)&local_98->_M_color + 1))
      ;
    }
    bVar3 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_b8);
    if (bVar3) {
      p_Var8 = (((_Rep_type *)&local_58->_M_impl)->_M_impl).super__Rb_tree_header._M_header._M_left;
      local_60 = &(((_Rep_type *)&local_58->_M_impl)->_M_impl).super__Rb_tree_header._M_header;
      if (p_Var8 != local_60) {
        do {
          __k = p_Var8 + 1;
          iVar5 = std::
                  _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>,_std::_Select1st<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>_>
                  ::find(&(((this->m).
                            super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->field_to_annotations)._M_t,__k);
          if ((_Rb_tree_header *)iVar5._M_node !=
              &(((this->m).
                 super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->field_to_annotations)._M_t._M_impl.super__Rb_tree_header) {
            p_Var1 = iVar5._M_node[1]._M_left;
            local_50._16_8_ = p_Var8;
            for (p_Var10 = iVar5._M_node[1]._M_parent; p_Var10 != p_Var1;
                p_Var10 = (_Base_ptr)&p_Var10[1]._M_right) {
              local_a8._8_8_ = p_Var10->_M_parent;
              local_98 = p_Var10->_M_left;
              if (local_98 != (_Base_ptr)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(int *)&local_98->_M_parent = *(int *)&local_98->_M_parent + 1;
                  UNLOCK();
                }
                else {
                  *(int *)&local_98->_M_parent = *(int *)&local_98->_M_parent + 1;
                }
              }
              local_90 = p_Var10->_M_right;
              local_88 = *(long *)(p_Var10 + 1);
              if (local_88 != 0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(int *)(local_88 + 8) = *(int *)(local_88 + 8) + 1;
                  UNLOCK();
                }
                else {
                  *(int *)(local_88 + 8) = *(int *)(local_88 + 8) + 1;
                }
              }
              local_a8._M_allocated_capacity = (size_type)&PTR__QPDFAnnotationObjectHelper_002f0050;
              local_80 = p_Var10[1]._M_parent;
              local_78 = p_Var10[1]._M_left;
              if (local_78 != (_Base_ptr)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(int *)&local_78->_M_parent = *(int *)&local_78->_M_parent + 1;
                  UNLOCK();
                }
                else {
                  *(int *)&local_78->_M_parent = *(int *)&local_78->_M_parent + 1;
                }
              }
              peVar2 = (this->m).
                       super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              if (local_98 != (_Base_ptr)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(int *)&local_98->_M_parent = *(int *)&local_98->_M_parent + 1;
                  UNLOCK();
                }
                else {
                  *(int *)&local_98->_M_parent = *(int *)&local_98->_M_parent + 1;
                }
              }
              local_70.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_a8._8_8_;
              local_70.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98;
              local_50._24_8_ = QPDFObjectHandle::getObjGen(&local_70);
              this_02 = &peVar2->annotation_to_field;
              pVar11 = std::
                       _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFFormFieldObjectHelper>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFFormFieldObjectHelper>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFFormFieldObjectHelper>_>_>
                       ::equal_range(&this_02->_M_t,(key_type *)(local_50 + 0x18));
              std::
              _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFFormFieldObjectHelper>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFFormFieldObjectHelper>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFFormFieldObjectHelper>_>_>
              ::_M_erase_aux(&this_02->_M_t,(_Base_ptr)pVar11.first._M_node,
                             (_Base_ptr)pVar11.second._M_node);
              if ((_Base_ptr)
                  local_70.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Base_ptr)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_70.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
              }
              QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper
                        ((QPDFAnnotationObjectHelper *)&local_a8);
            }
            this_03 = &((this->m).
                        super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->field_to_annotations;
            pVar12 = std::
                     _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>,_std::_Select1st<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>_>
                     ::equal_range(&this_03->_M_t,(key_type *)__k);
            p_Var8 = (_Base_ptr)local_50._16_8_;
            std::
            _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>,_std::_Select1st<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>_>
            ::_M_erase_aux(&this_03->_M_t,(_Base_ptr)pVar12.first._M_node,
                           (_Base_ptr)pVar12.second._M_node);
          }
          iVar6 = std::
                  _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::find(&(((this->m).
                            super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->field_to_name)._M_t,__k);
          peVar2 = (this->m).
                   super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          if ((_Rb_tree_header *)iVar6._M_node !=
              &(peVar2->field_to_name)._M_t._M_impl.super__Rb_tree_header) {
            __k_00 = &iVar6._M_node[1]._M_parent;
            this_00 = &std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                       ::operator[](&peVar2->name_to_fields,(key_type *)__k_00)->_M_t;
            pVar13 = std::
                     _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                     ::equal_range(this_00,(key_type *)__k);
            std::
            _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
            ::_M_erase_aux(this_00,(_Base_ptr)pVar13.first._M_node,(_Base_ptr)pVar13.second._M_node)
            ;
            pmVar7 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                     ::operator[](&((this->m).
                                    super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->name_to_fields,(key_type *)__k_00);
            if ((pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
              this_01 = &((this->m).
                          super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->name_to_fields;
              pVar14 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                       ::equal_range(&this_01->_M_t,(key_type *)__k_00);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
              ::_M_erase_aux(&this_01->_M_t,(_Base_ptr)pVar14.first._M_node,
                             (_Base_ptr)pVar14.second._M_node);
            }
            this_04 = &((this->m).
                        super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->field_to_name;
            pVar15 = std::
                     _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::equal_range(&this_04->_M_t,(key_type *)__k);
            std::
            _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::_M_erase_aux(&this_04->_M_t,(_Base_ptr)pVar15.first._M_node,
                           (_Base_ptr)pVar15.second._M_node);
          }
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
        } while (p_Var8 != local_60);
      }
      p_Var8 = local_60;
      at = 0;
      while (iVar4 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_b8), at < iVar4) {
        QPDFObjectHandle::getArrayItem
                  ((QPDFObjectHandle *)&local_a8,(int)(QPDFObjectHandle *)local_b8);
        local_70.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)QPDFObjectHandle::getObjGen((QPDFObjectHandle *)&local_a8);
        cVar9 = std::
                _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                ::find(local_58,(key_type *)&local_70);
        if (cVar9._M_node == p_Var8) {
          at = at + 1;
        }
        else {
          QPDFObjectHandle::eraseItem((QPDFObjectHandle *)local_b8,at);
        }
        if ((QPDFObjGen)local_a8._8_8_ != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
        }
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
  }
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::removeFormFields(std::set<QPDFObjGen> const& to_remove)
{
    auto acroform = qpdf.getRoot().getKey("/AcroForm");
    if (!acroform.isDictionary()) {
        return;
    }
    auto fields = acroform.getKey("/Fields");
    if (!fields.isArray()) {
        return;
    }

    for (auto const& og: to_remove) {
        auto annotations = m->field_to_annotations.find(og);
        if (annotations != m->field_to_annotations.end()) {
            for (auto aoh: annotations->second) {
                m->annotation_to_field.erase(aoh.getObjectHandle().getObjGen());
            }
            m->field_to_annotations.erase(og);
        }
        auto name = m->field_to_name.find(og);
        if (name != m->field_to_name.end()) {
            m->name_to_fields[name->second].erase(og);
            if (m->name_to_fields[name->second].empty()) {
                m->name_to_fields.erase(name->second);
            }
            m->field_to_name.erase(og);
        }
    }

    int i = 0;
    while (i < fields.getArrayNItems()) {
        auto field = fields.getArrayItem(i);
        if (to_remove.count(field.getObjGen())) {
            fields.eraseItem(i);
        } else {
            ++i;
        }
    }
}